

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::Printer
          (Printer *this,ZeroCopyOutputStream *output,char variable_delimiter,
          AnnotationCollector *annotation_collector)

{
  _Rb_tree_header *p_Var1;
  
  this->variable_delimiter_ = variable_delimiter;
  this->output_ = output;
  this->buffer_ = (char *)0x0;
  this->buffer_size_ = 0;
  this->offset_ = 0;
  (this->indent_)._M_dataplus._M_p = (pointer)&(this->indent_).field_2;
  (this->indent_)._M_string_length = 0;
  (this->indent_).field_2._M_local_buf[0] = '\0';
  this->at_start_of_line_ = true;
  this->failed_ = false;
  p_Var1 = &(this->substitutions_)._M_t._M_impl.super__Rb_tree_header;
  (this->substitutions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->substitutions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->substitutions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->substitutions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->substitutions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->annotation_collector_ = annotation_collector;
  return;
}

Assistant:

Printer::Printer(ZeroCopyOutputStream* output, char variable_delimiter,
                 AnnotationCollector* annotation_collector)
    : variable_delimiter_(variable_delimiter),
      output_(output),
      buffer_(NULL),
      buffer_size_(0),
      offset_(0),
      at_start_of_line_(true),
      failed_(false),
      annotation_collector_(annotation_collector) {}